

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

FileLoc * __thiscall pbrt::ParameterDictionary::loc(ParameterDictionary *this,string *name)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  pointer __s2;
  size_t sVar3;
  long lVar4;
  size_t __n;
  int iVar5;
  long lVar6;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar7;
  bool bVar8;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar7 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar7 = paVar1;
  }
  if (sVar2 != 0) {
    __s2 = (name->_M_dataplus)._M_p;
    sVar3 = name->_M_string_length;
    lVar6 = 0;
    do {
      lVar4 = *(long *)((long)paVar7 + lVar6);
      __n = *(size_t *)(lVar4 + 0x28);
      if (__n == sVar3) {
        if (__n == 0) {
          bVar8 = true;
        }
        else {
          iVar5 = bcmp(*(void **)(lVar4 + 0x20),__s2,__n);
          bVar8 = iVar5 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if (bVar8) {
        return (FileLoc *)(lVar4 + 0x40);
      }
      lVar6 = lVar6 + 8;
    } while (sVar2 << 3 != lVar6);
  }
  return (FileLoc *)0x0;
}

Assistant:

std::string ParameterDictionary::GetTexture(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name != name || p->type != "texture")
            continue;

        if (p->strings.empty())
            ErrorExit(&p->loc, "No string values provided for parameter \"%s\".", name);
        if (p->strings.size() > 1)
            ErrorExit(&p->loc, "More than one value provided for parameter \"%s\".",
                      name);
        p->lookedUp = true;
        return p->strings[0];
    }

    return "";
}